

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O3

size_t ZSTD_decompressMultiFrame
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,void *dict,
                 size_t dictSize,ZSTD_DDict *ddict)

{
  byte *src_00;
  ZSTD_format_e format;
  unsigned_long_long uVar1;
  ZSTD_ErrorCode ZVar2;
  ulong uVar3;
  ulong srcSize_00;
  ulong uVar4;
  XXH64_hash_t XVar5;
  size_t err_code;
  size_t sVar6;
  ulong uVar7;
  void *dst_00;
  uint *local_a0;
  ulong local_98;
  size_t local_68;
  blockProperties_t local_5c;
  size_t local_50;
  undefined8 local_48;
  void *local_40;
  void *local_38;
  
  local_50 = dictSize;
  if (ddict != (ZSTD_DDict *)0x0) {
    dict = ZSTD_DDict_dictContent(ddict);
    local_50 = ZSTD_DDict_dictSize(ddict);
  }
  uVar3 = (ulong)(dctx->format == ZSTD_f_zstd1) * 4 + 1;
  local_98 = srcSize;
  local_38 = dst;
  if (uVar3 <= srcSize) {
    local_48 = 0;
    local_68 = dstCapacity;
    local_40 = dict;
    do {
      while ((*src & 0xfffffff0) != 0x184d2a50) {
        if (ddict == (ZSTD_DDict *)0x0) {
          sVar6 = ZSTD_decompressBegin_usingDict(dctx,local_40,local_50);
          if (0xffffffffffffff88 < sVar6) {
            return sVar6;
          }
        }
        else {
          ZSTD_decompressBegin_usingDDict(dctx,ddict);
        }
        ZSTD_checkContinuity(dctx,dst,local_68);
        format = dctx->format;
        if (local_98 < (ulong)(format == ZSTD_f_zstd1) * 4 + 5) {
LAB_00640e22:
          uVar3 = 0xffffffffffffffb8;
        }
        else {
          sVar6 = ZSTD_frameHeaderSize_internal(src,(ulong)(format == ZSTD_f_zstd1) * 4 + 1,format);
          uVar3 = sVar6;
          if (sVar6 < 0xffffffffffffff89) {
            if (local_98 < sVar6 + 3) goto LAB_00640e22;
            uVar3 = ZSTD_decodeFrameHeader(dctx,src,sVar6);
            if (uVar3 < 0xffffffffffffff89) {
              local_a0 = (uint *)(sVar6 + (long)src);
              uVar7 = local_98 - sVar6;
              srcSize_00 = ZSTD_getcBlockSize(local_a0,uVar7,&local_5c);
              dst_00 = dst;
              while (uVar3 = srcSize_00, srcSize_00 < 0xffffffffffffff89) {
                uVar4 = uVar7 - 3;
                uVar7 = uVar4 - srcSize_00;
                if (uVar4 < srcSize_00) {
                  uVar3 = 0xffffffffffffffb8;
                  break;
                }
                src_00 = (byte *)((long)local_a0 + 3);
                if (local_5c.blockType == bt_compressed) {
                  uVar3 = ZSTD_decompressBlock_internal
                                    (dctx,dst_00,(long)dst + (local_68 - (long)dst_00),src_00,
                                     srcSize_00,1);
                  if (0xffffffffffffff88 < uVar3) break;
                }
                else if (local_5c.blockType == bt_rle) {
                  uVar3 = (ulong)local_5c.origSize;
                  if ((long)dst + (local_68 - (long)dst_00) < uVar3) {
LAB_0064109d:
                    uVar3 = 0xffffffffffffffba;
                    break;
                  }
                  if (dst_00 == (void *)0x0) {
joined_r0x00640f91:
                    if (uVar3 != 0) {
                      uVar3 = 0xffffffffffffffb6;
                      break;
                    }
                    uVar3 = 0;
                  }
                  else {
                    memset(dst_00,(uint)*src_00,uVar3);
                  }
                }
                else {
                  if (local_5c.blockType != bt_raw) {
                    uVar3 = 0xffffffffffffffec;
                    break;
                  }
                  if ((long)dst + (local_68 - (long)dst_00) < srcSize_00) goto LAB_0064109d;
                  if (dst_00 == (void *)0x0) goto joined_r0x00640f91;
                  memcpy(dst_00,src_00,srcSize_00);
                }
                if (dctx->validateChecksum != 0) {
                  XXH64_update(&dctx->xxhState,dst_00,uVar3);
                }
                dst_00 = (void *)((long)dst_00 + uVar3);
                local_a0 = (uint *)(src_00 + srcSize_00);
                if (local_5c.lastBlock != 0) {
                  uVar1 = (dctx->fParams).frameContentSize;
                  uVar3 = (long)dst_00 - (long)dst;
                  if ((uVar1 != 0xffffffffffffffff) && (uVar3 != uVar1)) {
                    uVar3 = 0xffffffffffffffec;
                    break;
                  }
                  if ((dctx->fParams).checksumFlag != 0) {
                    if ((uVar7 < 4) ||
                       ((dctx->forceIgnoreChecksum == ZSTD_d_validateChecksum &&
                        (XVar5 = XXH64_digest(&dctx->xxhState), *local_a0 != (uint)XVar5)))) {
                      uVar3 = 0xffffffffffffffea;
                      break;
                    }
                    local_a0 = local_a0 + 1;
                    uVar7 = uVar7 - 4;
                  }
                  local_98 = uVar7;
                  ZSTD_DCtx_trace_end(dctx,uVar3,(long)local_a0 - (long)src,0);
                  src = local_a0;
                  break;
                }
                srcSize_00 = ZSTD_getcBlockSize(local_a0,uVar7,&local_5c);
              }
            }
          }
        }
        sVar6 = uVar3;
        ZVar2 = ZSTD_getErrorCode(uVar3);
        if (((byte)local_48 & ZVar2 == ZSTD_error_prefix_unknown) != 0) {
          return 0xffffffffffffffb8;
        }
        if (0xffffffffffffff88 < uVar3) {
          return uVar3;
        }
        dst = (void *)((long)dst + uVar3);
        local_68 = local_68 - uVar3;
        uVar3 = (ulong)(dctx->format == ZSTD_f_zstd1) * 4 + 1;
        local_48 = CONCAT71((int7)(sVar6 >> 8),1);
        if (local_98 < uVar3) goto LAB_00640d28;
      }
      if (local_98 < 8) {
        return 0xffffffffffffffb8;
      }
      if (0x1ffffffe < *(uint *)((long)src + 4) >> 3) {
        return 0xfffffffffffffff2;
      }
      uVar7 = (ulong)*(uint *)((long)src + 4) + 8;
      if (local_98 < uVar7) {
        uVar7 = 0xffffffffffffffb8;
      }
      if (0xffffffffffffff88 < uVar7) {
        return uVar7;
      }
      src = (void *)((long)src + uVar7);
      local_98 = local_98 - uVar7;
    } while (uVar3 <= local_98);
  }
LAB_00640d28:
  sVar6 = 0xffffffffffffffb8;
  if (local_98 == 0) {
    sVar6 = (long)dst - (long)local_38;
  }
  return sVar6;
}

Assistant:

static size_t ZSTD_decompressMultiFrame(ZSTD_DCtx* dctx,
                                        void* dst, size_t dstCapacity,
                                  const void* src, size_t srcSize,
                                  const void* dict, size_t dictSize,
                                  const ZSTD_DDict* ddict)
{
    void* const dststart = dst;
    int moreThan1Frame = 0;

    DEBUGLOG(5, "ZSTD_decompressMultiFrame");
    assert(dict==NULL || ddict==NULL);  /* either dict or ddict set, not both */

    if (ddict) {
        dict = ZSTD_DDict_dictContent(ddict);
        dictSize = ZSTD_DDict_dictSize(ddict);
    }

    while (srcSize >= ZSTD_startingInputLength(dctx->format)) {

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
        if (ZSTD_isLegacy(src, srcSize)) {
            size_t decodedSize;
            size_t const frameSize = ZSTD_findFrameCompressedSizeLegacy(src, srcSize);
            if (ZSTD_isError(frameSize)) return frameSize;
            RETURN_ERROR_IF(dctx->staticSize, memory_allocation,
                "legacy support is not compatible with static dctx");

            decodedSize = ZSTD_decompressLegacy(dst, dstCapacity, src, frameSize, dict, dictSize);
            if (ZSTD_isError(decodedSize)) return decodedSize;

            assert(decodedSize <= dstCapacity);
            dst = (BYTE*)dst + decodedSize;
            dstCapacity -= decodedSize;

            src = (const BYTE*)src + frameSize;
            srcSize -= frameSize;

            continue;
        }
#endif

        {   U32 const magicNumber = MEM_readLE32(src);
            DEBUGLOG(4, "reading magic number %08X (expecting %08X)",
                        (unsigned)magicNumber, ZSTD_MAGICNUMBER);
            if ((magicNumber & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
                size_t const skippableSize = readSkippableFrameSize(src, srcSize);
                FORWARD_IF_ERROR(skippableSize, "readSkippableFrameSize failed");
                assert(skippableSize <= srcSize);

                src = (const BYTE *)src + skippableSize;
                srcSize -= skippableSize;
                continue;
        }   }

        if (ddict) {
            /* we were called from ZSTD_decompress_usingDDict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDDict(dctx, ddict), "");
        } else {
            /* this will initialize correctly with no dict if dict == NULL, so
             * use this in all cases but ddict */
            FORWARD_IF_ERROR(ZSTD_decompressBegin_usingDict(dctx, dict, dictSize), "");
        }
        ZSTD_checkContinuity(dctx, dst, dstCapacity);

        {   const size_t res = ZSTD_decompressFrame(dctx, dst, dstCapacity,
                                                    &src, &srcSize);
            RETURN_ERROR_IF(
                (ZSTD_getErrorCode(res) == ZSTD_error_prefix_unknown)
             && (moreThan1Frame==1),
                srcSize_wrong,
                "At least one frame successfully completed, "
                "but following bytes are garbage: "
                "it's more likely to be a srcSize error, "
                "specifying more input bytes than size of frame(s). "
                "Note: one could be unlucky, it might be a corruption error instead, "
                "happening right at the place where we expect zstd magic bytes. "
                "But this is _much_ less likely than a srcSize field error.");
            if (ZSTD_isError(res)) return res;
            assert(res <= dstCapacity);
            if (res != 0)
                dst = (BYTE*)dst + res;
            dstCapacity -= res;
        }
        moreThan1Frame = 1;
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    RETURN_ERROR_IF(srcSize, srcSize_wrong, "input not entirely consumed");

    return (size_t)((BYTE*)dst - (BYTE*)dststart);
}